

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::ValidationContextImpl::getURIForPrefix(ValidationContextImpl *this,XMLCh *prefix)

{
  uint uVar1;
  uint local_28;
  bool local_21;
  uint uriId;
  bool unknown;
  XMLCh *prefix_local;
  ValidationContextImpl *this_local;
  
  local_21 = false;
  local_28 = 0;
  _uriId = prefix;
  prefix_local = (XMLCh *)this;
  if (this->fElemStack == (ElemStack *)0x0) {
    if (this->fNamespaceScope != (NamespaceScope *)0x0) {
      local_28 = (**(this->fNamespaceScope->super_XercesNamespaceResolver).
                    _vptr_XercesNamespaceResolver)(this->fNamespaceScope,prefix);
      uVar1 = NamespaceScope::getEmptyNamespaceId(this->fNamespaceScope);
      local_21 = local_28 == uVar1;
    }
  }
  else {
    local_28 = ElemStack::mapPrefixToURI(this->fElemStack,prefix,&local_21);
  }
  if ((local_21 & 1U) == 0) {
    this_local = (ValidationContextImpl *)XMLScanner::getURIText(this->fScanner,local_28);
  }
  else {
    this_local = (ValidationContextImpl *)&XMLUni::fgZeroLenString;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* ValidationContextImpl::getURIForPrefix(XMLCh* prefix) {
    bool unknown = false;
    unsigned int uriId = 0;
    if(fElemStack)
        uriId = fElemStack->mapPrefixToURI(prefix, unknown);
    else if(fNamespaceScope)
    {
      uriId = fNamespaceScope->getNamespaceForPrefix(prefix);
      unknown = uriId == fNamespaceScope->getEmptyNamespaceId();
    }
    if (!unknown)
        return fScanner->getURIText(uriId);

    return XMLUni::fgZeroLenString;
}